

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::RunwayStateGroup::Deposits> metaf::RunwayStateGroup::depositsFromString(string *s)

{
  long lVar1;
  char *pcVar2;
  optional<metaf::RunwayStateGroup::Deposits> *this;
  ulong in_RDI;
  optional<metaf::RunwayStateGroup::Deposits> error;
  Deposits *in_stack_ffffffffffffffa8;
  _Optional_payload_base<metaf::RunwayStateGroup::Deposits> local_18;
  _Optional_payload_base<metaf::RunwayStateGroup::Deposits> local_8;
  
  std::optional<metaf::RunwayStateGroup::Deposits>::optional
            ((optional<metaf::RunwayStateGroup::Deposits> *)0x25c223);
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RDI);
    this = (optional<metaf::RunwayStateGroup::Deposits> *)(ulong)((int)*pcVar2 - 0x2f);
    switch(this) {
    case (optional<metaf::RunwayStateGroup::Deposits> *)0x0:
      std::optional<metaf::RunwayStateGroup::Deposits>::
      optional<metaf::RunwayStateGroup::Deposits,_true>(this,in_stack_ffffffffffffffa8);
      break;
    case (optional<metaf::RunwayStateGroup::Deposits> *)0x1:
      std::optional<metaf::RunwayStateGroup::Deposits>::
      optional<metaf::RunwayStateGroup::Deposits,_true>(this,in_stack_ffffffffffffffa8);
      break;
    case (optional<metaf::RunwayStateGroup::Deposits> *)0x2:
      std::optional<metaf::RunwayStateGroup::Deposits>::
      optional<metaf::RunwayStateGroup::Deposits,_true>(this,in_stack_ffffffffffffffa8);
      break;
    case (optional<metaf::RunwayStateGroup::Deposits> *)0x3:
      std::optional<metaf::RunwayStateGroup::Deposits>::
      optional<metaf::RunwayStateGroup::Deposits,_true>(this,in_stack_ffffffffffffffa8);
      break;
    case (optional<metaf::RunwayStateGroup::Deposits> *)0x4:
      std::optional<metaf::RunwayStateGroup::Deposits>::
      optional<metaf::RunwayStateGroup::Deposits,_true>(this,in_stack_ffffffffffffffa8);
      break;
    case (optional<metaf::RunwayStateGroup::Deposits> *)0x5:
      std::optional<metaf::RunwayStateGroup::Deposits>::
      optional<metaf::RunwayStateGroup::Deposits,_true>(this,in_stack_ffffffffffffffa8);
      break;
    case (optional<metaf::RunwayStateGroup::Deposits> *)0x6:
      std::optional<metaf::RunwayStateGroup::Deposits>::
      optional<metaf::RunwayStateGroup::Deposits,_true>(this,in_stack_ffffffffffffffa8);
      break;
    case (optional<metaf::RunwayStateGroup::Deposits> *)0x7:
      std::optional<metaf::RunwayStateGroup::Deposits>::
      optional<metaf::RunwayStateGroup::Deposits,_true>(this,in_stack_ffffffffffffffa8);
      break;
    case (optional<metaf::RunwayStateGroup::Deposits> *)0x8:
      std::optional<metaf::RunwayStateGroup::Deposits>::
      optional<metaf::RunwayStateGroup::Deposits,_true>(this,in_stack_ffffffffffffffa8);
      break;
    case (optional<metaf::RunwayStateGroup::Deposits> *)0x9:
      std::optional<metaf::RunwayStateGroup::Deposits>::
      optional<metaf::RunwayStateGroup::Deposits,_true>(this,in_stack_ffffffffffffffa8);
      break;
    case (optional<metaf::RunwayStateGroup::Deposits> *)0xa:
      std::optional<metaf::RunwayStateGroup::Deposits>::
      optional<metaf::RunwayStateGroup::Deposits,_true>(this,in_stack_ffffffffffffffa8);
      break;
    default:
      local_8 = local_18;
    }
  }
  else {
    local_8 = local_18;
  }
  return (optional<metaf::RunwayStateGroup::Deposits>)local_8;
}

Assistant:

std::optional<RunwayStateGroup::Deposits> RunwayStateGroup::depositsFromString(
	const std::string & s)
{
	std::optional<Deposits> error;
	if (s.length() != 1) return error;
	switch (s[0]) {
		case '0': return Deposits::CLEAR_AND_DRY;
		case '1': return Deposits::DAMP;
		case '2': return Deposits::WET_AND_WATER_PATCHES;
		case '3': return Deposits::RIME_AND_FROST_COVERED;
		case '4': return Deposits::DRY_SNOW;
		case '5': return Deposits::WET_SNOW;
		case '6': return Deposits::SLUSH;
		case '7': return Deposits::ICE;
		case '8': return Deposits::COMPACTED_OR_ROLLED_SNOW;
		case '9': return Deposits::FROZEN_RUTS_OR_RIDGES;
		case '/': return Deposits::NOT_REPORTED;
		default:  return error;
	}
}